

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-diag.c
# Opt level: O1

int fy_vdiag(fy_diag *diag,fy_diag_ctx *fydc,char *fmt,__va_list_tag *ap)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  ulong uVar12;
  char *pcVar13;
  fy_error_type fVar14;
  char *pcVar15;
  ulong uVar16;
  char *pcVar17;
  ulong uVar18;
  ulong uVar19;
  undefined8 uStack_80;
  undefined8 uStack_78;
  va_list _ap_orig;
  char *local_50;
  char *local_40;
  char *local_38;
  
  pcVar17 = (char *)&uStack_78;
  if (fmt == (char *)0x0 || (fydc == (fy_diag_ctx *)0x0 || diag == (fy_diag *)0x0)) {
    return -1;
  }
  fVar14 = fydc->level;
  if ((FYET_WARNING < fVar14) && ((diag->field_0x3c & 1) != 0)) {
    fVar14 = FYET_NOTICE;
  }
  iVar5 = 0;
  if ((fVar14 < (diag->cfg).level) ||
     (iVar5 = 0, ((diag->cfg).module_mask >> (fydc->module & 0x1f) & 1) == 0)) goto LAB_0011b021;
  _ap_orig[0].overflow_arg_area = ap->reg_save_area;
  uStack_78._0_4_ = ap->gp_offset;
  uStack_78._4_4_ = ap->fp_offset;
  _ap_orig[0]._0_8_ = ap->overflow_arg_area;
  local_50 = (char *)0x0;
  uStack_80 = 0x11ab7a;
  iVar5 = vsnprintf((char *)0x0,0,fmt,&uStack_78);
  if (iVar5 != -1) {
    lVar3 = -((long)iVar5 + 0x10U & 0xfffffffffffffff0);
    pcVar17 = (char *)((long)_ap_orig + lVar3 + -8);
    *(undefined8 *)((long)&uStack_80 + lVar3) = 0x11abab;
    iVar6 = vsnprintf(pcVar17,(long)iVar5 + 1,fmt,ap);
    if (iVar5 != iVar6) {
      *(undefined8 *)((long)&uStack_80 + lVar3) = 0x11b06d;
      __assert_fail("_size == _sizew",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-diag.c"
                    ,0x10a,
                    "int fy_vdiag(struct fy_diag *, const struct fy_diag_ctx *, const char *, struct __va_list_tag *)"
                   );
    }
    *(undefined8 *)((long)&uStack_80 + lVar3) = 0x11abbc;
    sVar7 = strlen(pcVar17);
    local_50 = pcVar17;
    if (0 < (long)sVar7) {
      pcVar8 = pcVar17 + sVar7;
      do {
        if (pcVar8[-1] != '\n') break;
        pcVar8 = pcVar8 + -1;
        *pcVar8 = '\0';
      } while (pcVar17 < pcVar8);
    }
  }
  if (((diag->cfg).field_0x20 & 2) == 0) {
    pcVar8 = (char *)0x0;
  }
  else {
    pcVar8 = fydc->source_file;
    if (pcVar8 == (char *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar17[-8] = '\x01';
      pcVar17[-7] = -0x54;
      pcVar17[-6] = '\x11';
      pcVar17[-5] = '\0';
      pcVar17[-4] = '\0';
      pcVar17[-3] = '\0';
      pcVar17[-2] = '\0';
      pcVar17[-1] = '\0';
      pcVar10 = strrchr(pcVar8,0x2f);
      pcVar9 = pcVar10 + 1;
      if (pcVar10 == (char *)0x0) {
        pcVar9 = pcVar8;
      }
    }
    uVar1 = fydc->source_line;
    pcVar8 = fydc->source_func;
    *(char **)(pcVar17 + -0x10) = " ";
    pcVar17[-0x18] = 'B';
    pcVar17[-0x17] = -0x54;
    pcVar17[-0x16] = '\x11';
    pcVar17[-0x15] = '\0';
    pcVar17[-0x14] = '\0';
    pcVar17[-0x13] = '\0';
    pcVar17[-0x12] = '\0';
    pcVar17[-0x11] = '\0';
    iVar5 = snprintf((char *)0x0,0,"%s:%d @%s()%s",pcVar9,(ulong)uVar1,pcVar8);
    pcVar8 = (char *)0x0;
    if (iVar5 != -1) {
      pcVar17 = pcVar17 + -((long)iVar5 + 0x10U & 0xfffffffffffffff0);
      uVar1 = fydc->source_line;
      pcVar8 = fydc->source_func;
      *(char **)(pcVar17 + -0x10) = " ";
      pcVar17[-0x18] = -0x72;
      pcVar17[-0x17] = -0x54;
      pcVar17[-0x16] = '\x11';
      pcVar17[-0x15] = '\0';
      pcVar17[-0x14] = '\0';
      pcVar17[-0x13] = '\0';
      pcVar17[-0x12] = '\0';
      pcVar17[-0x11] = '\0';
      iVar6 = snprintf(pcVar17,(long)iVar5 + 1,"%s:%d @%s()%s",pcVar9,(ulong)uVar1,pcVar8);
      if (iVar5 != iVar6) {
        pcVar17[-8] = -0x74;
        pcVar17[-7] = -0x50;
        pcVar17[-6] = '\x11';
        pcVar17[-5] = '\0';
        pcVar17[-4] = '\0';
        pcVar17[-3] = '\0';
        pcVar17[-2] = '\0';
        pcVar17[-1] = '\0';
        __assert_fail("_size == _sizew",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-diag.c"
                      ,0x117,
                      "int fy_vdiag(struct fy_diag *, const struct fy_diag_ctx *, const char *, struct __va_list_tag *)"
                     );
      }
      pcVar17[-8] = -0x5d;
      pcVar17[-7] = -0x54;
      pcVar17[-6] = '\x11';
      pcVar17[-5] = '\0';
      pcVar17[-4] = '\0';
      pcVar17[-3] = '\0';
      pcVar17[-2] = '\0';
      pcVar17[-1] = '\0';
      sVar7 = strlen(pcVar17);
      pcVar8 = pcVar17;
      if (0 < (long)sVar7) {
        pcVar9 = pcVar17 + sVar7;
        do {
          if (pcVar9[-1] != '\n') break;
          pcVar9 = pcVar9 + -1;
          *pcVar9 = '\0';
        } while (pcVar17 < pcVar9);
      }
    }
  }
  if (((((diag->cfg).field_0x20 & 4) == 0) || (uVar1 = fydc->line, (int)uVar1 < 0)) ||
     (uVar2 = fydc->column, (int)uVar2 < 0)) {
    pcVar9 = (char *)0x0;
  }
  else {
    pcVar17[-8] = -5;
    pcVar17[-7] = -0x54;
    pcVar17[-6] = '\x11';
    pcVar17[-5] = '\0';
    pcVar17[-4] = '\0';
    pcVar17[-3] = '\0';
    pcVar17[-2] = '\0';
    pcVar17[-1] = '\0';
    iVar5 = snprintf((char *)0x0,0,"<%3d:%2d>%s",(ulong)uVar1,(ulong)uVar2,": ");
    pcVar9 = (char *)0x0;
    if (iVar5 != -1) {
      pcVar17 = pcVar17 + -((long)iVar5 + 0x10U & 0xfffffffffffffff0);
      uVar1 = fydc->line;
      uVar2 = fydc->column;
      pcVar17[-8] = ':';
      pcVar17[-7] = -0x53;
      pcVar17[-6] = '\x11';
      pcVar17[-5] = '\0';
      pcVar17[-4] = '\0';
      pcVar17[-3] = '\0';
      pcVar17[-2] = '\0';
      pcVar17[-1] = '\0';
      iVar6 = snprintf(pcVar17,(long)iVar5 + 1,"<%3d:%2d>%s",(ulong)uVar1,(ulong)uVar2,": ");
      if (iVar5 != iVar6) {
        *(code **)(pcVar17 + -8) = fy_diagf;
        __assert_fail("_size == _sizew",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-diag.c"
                      ,0x11c,
                      "int fy_vdiag(struct fy_diag *, const struct fy_diag_ctx *, const char *, struct __va_list_tag *)"
                     );
      }
      pcVar17[-8] = 'K';
      pcVar17[-7] = -0x53;
      pcVar17[-6] = '\x11';
      pcVar17[-5] = '\0';
      pcVar17[-4] = '\0';
      pcVar17[-3] = '\0';
      pcVar17[-2] = '\0';
      pcVar17[-1] = '\0';
      sVar7 = strlen(pcVar17);
      pcVar9 = pcVar17;
      if (0 < (long)sVar7) {
        pcVar10 = pcVar17 + sVar7;
        do {
          if (pcVar10[-1] != '\n') break;
          pcVar10 = pcVar10 + -1;
          *pcVar10 = '\0';
        } while (pcVar17 < pcVar10);
      }
    }
  }
  if (((diag->cfg).field_0x20 & 8) == 0) {
    local_40 = (char *)0x0;
  }
  else {
    if (fVar14 < FYET_MAX) {
      pcVar10 = *(char **)(fy_error_level_str_txt + (ulong)fVar14 * 8);
    }
    else {
      pcVar10 = "*unknown*";
    }
    local_40 = (char *)0x0;
    builtin_strncpy(pcVar17 + -8,"­\x11",4);
    pcVar17[-4] = '\0';
    pcVar17[-3] = '\0';
    pcVar17[-2] = '\0';
    pcVar17[-1] = '\0';
    iVar5 = snprintf((char *)0x0,0,"[%s]%s",pcVar10,": ");
    if (iVar5 != -1) {
      pcVar17 = pcVar17 + -((long)iVar5 + 0x10U & 0xfffffffffffffff0);
      if (fVar14 < FYET_MAX) {
        pcVar10 = *(char **)(fy_error_level_str_txt + (ulong)fVar14 * 8);
      }
      else {
        pcVar10 = "*unknown*";
      }
      pcVar17[-8] = '\"';
      pcVar17[-7] = -0x52;
      pcVar17[-6] = '\x11';
      pcVar17[-5] = '\0';
      pcVar17[-4] = '\0';
      pcVar17[-3] = '\0';
      pcVar17[-2] = '\0';
      pcVar17[-1] = '\0';
      iVar6 = snprintf(pcVar17,(long)iVar5 + 1,"[%s]%s",pcVar10,": ");
      if (iVar5 != iVar6) {
        pcVar17[-8] = -0x55;
        pcVar17[-7] = -0x50;
        pcVar17[-6] = '\x11';
        pcVar17[-5] = '\0';
        pcVar17[-4] = '\0';
        pcVar17[-3] = '\0';
        pcVar17[-2] = '\0';
        pcVar17[-1] = '\0';
        __assert_fail("_size == _sizew",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-diag.c"
                      ,0x120,
                      "int fy_vdiag(struct fy_diag *, const struct fy_diag_ctx *, const char *, struct __va_list_tag *)"
                     );
      }
      pcVar17[-8] = '3';
      pcVar17[-7] = -0x52;
      pcVar17[-6] = '\x11';
      pcVar17[-5] = '\0';
      pcVar17[-4] = '\0';
      pcVar17[-3] = '\0';
      pcVar17[-2] = '\0';
      pcVar17[-1] = '\0';
      sVar7 = strlen(pcVar17);
      local_40 = pcVar17;
      if (0 < (long)sVar7) {
        pcVar10 = pcVar17 + sVar7;
        do {
          if (pcVar10[-1] != '\n') break;
          pcVar10 = pcVar10 + -1;
          *pcVar10 = '\0';
        } while (pcVar17 < pcVar10);
      }
    }
  }
  pcVar10 = pcVar17;
  if (((diag->cfg).field_0x20 & 0x10) == 0) {
    pcVar11 = (char *)0x0;
  }
  else {
    if ((ulong)fydc->module < 8) {
      pcVar11 = *(char **)(fy_error_module_str_txt + (ulong)fydc->module * 8);
    }
    else {
      pcVar11 = "*unknown*";
    }
    pcVar17[-8] = -0x6c;
    pcVar17[-7] = -0x52;
    pcVar17[-6] = '\x11';
    pcVar17[-5] = '\0';
    pcVar17[-4] = '\0';
    pcVar17[-3] = '\0';
    pcVar17[-2] = '\0';
    pcVar17[-1] = '\0';
    iVar5 = snprintf((char *)0x0,0,"<%s>%s",pcVar11,": ");
    pcVar11 = (char *)0x0;
    if (iVar5 != -1) {
      lVar3 = -((long)iVar5 + 0x10U & 0xfffffffffffffff0);
      pcVar10 = pcVar17 + lVar3;
      if ((ulong)fydc->module < 8) {
        pcVar11 = *(char **)(fy_error_module_str_txt + (ulong)fydc->module * 8);
      }
      else {
        pcVar11 = "*unknown*";
      }
      pcVar10[-8] = -0x17;
      pcVar10[-7] = -0x52;
      pcVar10[-6] = '\x11';
      pcVar10[-5] = '\0';
      pcVar10[-4] = '\0';
      pcVar10[-3] = '\0';
      pcVar10[-2] = '\0';
      pcVar10[-1] = '\0';
      iVar6 = snprintf(pcVar10,(long)iVar5 + 1,"<%s>%s",pcVar11,": ");
      if (iVar5 != iVar6) {
        builtin_strncpy(pcVar17 + lVar3 + -8,"ʰ\x11",4);
        pcVar10[-4] = '\0';
        pcVar10[-3] = '\0';
        pcVar10[-2] = '\0';
        pcVar10[-1] = '\0';
        __assert_fail("_size == _sizew",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-diag.c"
                      ,0x124,
                      "int fy_vdiag(struct fy_diag *, const struct fy_diag_ctx *, const char *, struct __va_list_tag *)"
                     );
      }
      pcVar10[-8] = -6;
      pcVar10[-7] = -0x52;
      pcVar10[-6] = '\x11';
      pcVar10[-5] = '\0';
      pcVar10[-4] = '\0';
      pcVar10[-3] = '\0';
      pcVar10[-2] = '\0';
      pcVar10[-1] = '\0';
      sVar7 = strlen(pcVar10);
      pcVar11 = pcVar10;
      if (0 < (long)sVar7) {
        pcVar17 = pcVar10 + sVar7;
        do {
          if (pcVar17[-1] != '\n') break;
          pcVar17 = pcVar17 + -1;
          *pcVar17 = '\0';
        } while (pcVar10 < pcVar17);
      }
    }
  }
  pcVar17 = "";
  uVar12 = 0;
  if (((diag->cfg).field_0x20 & 1) == 0) {
    local_38 = "";
    pcVar13 = (char *)0x0;
  }
  else {
    switch(fVar14) {
    case FYET_DEBUG:
      pcVar13 = "\x1b[37m";
      break;
    case FYET_INFO:
      pcVar13 = "\x1b[37;1m";
      break;
    case FYET_NOTICE:
      pcVar13 = "\x1b[34;1m";
      break;
    case FYET_WARNING:
      pcVar13 = "\x1b[33;1m";
      break;
    case FYET_ERROR:
      pcVar13 = "\x1b[31;1m";
      break;
    default:
      bVar4 = true;
      pcVar13 = (char *)0x0;
      goto LAB_0011af75;
    }
    bVar4 = false;
LAB_0011af75:
    local_38 = "\x1b[0m";
    if (bVar4) {
      local_38 = "";
      pcVar13 = (char *)0x0;
    }
  }
  if (pcVar13 == (char *)0x0) {
    pcVar13 = "";
  }
  pcVar15 = "";
  if (pcVar8 != (char *)0x0) {
    uVar12 = (ulong)(uint)(diag->cfg).source_width;
    pcVar15 = pcVar8;
  }
  uVar19 = 0;
  uVar16 = 0;
  pcVar8 = "";
  if (pcVar9 != (char *)0x0) {
    uVar16 = (ulong)(uint)(diag->cfg).position_width;
    pcVar8 = pcVar9;
  }
  pcVar9 = "";
  if (local_40 != (char *)0x0) {
    uVar19 = (ulong)(uint)(diag->cfg).type_width;
    pcVar9 = local_40;
  }
  if (pcVar11 == (char *)0x0) {
    uVar18 = 0;
  }
  else {
    uVar18 = (ulong)(uint)(diag->cfg).module_width;
    pcVar17 = pcVar11;
  }
  *(char **)(pcVar10 + -0x10) = local_38;
  *(char **)(pcVar10 + -0x18) = local_50;
  *(char **)(pcVar10 + -0x20) = pcVar17;
  *(ulong *)(pcVar10 + -0x28) = uVar18;
  *(char **)(pcVar10 + -0x30) = pcVar9;
  *(ulong *)(pcVar10 + -0x38) = uVar19;
  *(char **)(pcVar10 + -0x40) = pcVar8;
  pcVar10[-0x48] = '\x0e';
  pcVar10[-0x47] = -0x50;
  pcVar10[-0x46] = '\x11';
  pcVar10[-0x45] = '\0';
  pcVar10[-0x44] = '\0';
  pcVar10[-0x43] = '\0';
  pcVar10[-0x42] = '\0';
  pcVar10[-0x41] = '\0';
  iVar5 = fy_diag_printf(diag,"%s%*s%*s%*s%*s%s%s\n",pcVar13,uVar12,pcVar15,uVar16);
  iVar5 = (uint)(0 < iVar5) + iVar5;
LAB_0011b021:
  if (((diag->field_0x3c & 1) == 0) && (FYET_WARNING < fydc->level)) {
    diag->field_0x3c = diag->field_0x3c | 1;
  }
  return iVar5;
}

Assistant:

int fy_vdiag(struct fy_diag *diag, const struct fy_diag_ctx *fydc,
             const char *fmt, va_list ap) {
    char *msg = NULL;
    char *source = NULL, *position = NULL, *typestr = NULL, *modulestr = NULL;
    const char *file_stripped = NULL;
    const char *color_start = NULL, *color_end = NULL;
    enum fy_error_type level;
    int rc;

    if (!diag || !fydc || !fmt)
        return -1;

    level = fydc->level;

    /* turn errors into notices while not reset */
    if (level >= FYET_ERROR && diag->on_error)
        level = FYET_NOTICE;

    if (level < diag->cfg.level) {
        rc = 0;
        goto out;
    }

    /* check module enable mask */
    if (!(diag->cfg.module_mask & FY_BIT(fydc->module))) {
        rc = 0;
        goto out;
    }

    msg = alloca_vsprintf(fmt, ap);

    /* source part */
    if (diag->cfg.show_source) {
        if (fydc->source_file) {
            file_stripped = strrchr(fydc->source_file, '/');
            if (!file_stripped)
                file_stripped = fydc->source_file;
            else
                file_stripped++;
        } else
            file_stripped = "";
        source = alloca_sprintf("%s:%d @%s()%s",
                                file_stripped, fydc->source_line, fydc->source_func, " ");
    }

    /* position part */
    if (diag->cfg.show_position && fydc->line >= 0 && fydc->column >= 0)
        position = alloca_sprintf("<%3d:%2d>%s", fydc->line, fydc->column, ": ");

    /* type part */
    if (diag->cfg.show_type)
        typestr = alloca_sprintf("[%s]%s", fy_error_level_str(level), ": ");

    /* module part */
    if (diag->cfg.show_module)
        modulestr = alloca_sprintf("<%s>%s", fy_error_module_str(fydc->module), ": ");

    if (diag->cfg.colorize) {
        switch (level) {
            case FYET_DEBUG:
                color_start = "\x1b[37m";    /* normal white */
                break;
            case FYET_INFO:
                color_start = "\x1b[37;1m";    /* bright white */
                break;
            case FYET_NOTICE:
                color_start = "\x1b[34;1m";    /* bright blue */
                break;
            case FYET_WARNING:
                color_start = "\x1b[33;1m";    /* bright yellow */
                break;
            case FYET_ERROR:
                color_start = "\x1b[31;1m";    /* bright red */
                break;
            default:    /* handles FYET_MAX */
                break;
        }
        if (color_start)
            color_end = "\x1b[0m";
    }

    rc = fy_diag_printf(diag, "%s" "%*s" "%*s" "%*s" "%*s" "%s" "%s\n",
                        color_start ?: "",
                        source ? diag->cfg.source_width : 0, source ?: "",
                        position ? diag->cfg.position_width : 0, position ?: "",
                        typestr ? diag->cfg.type_width : 0, typestr ?: "",
                        modulestr ? diag->cfg.module_width : 0, modulestr ?: "",
                        msg,
                        color_end ?: "");

    if (rc > 0)
        rc++;

    out:
    /* if it's the first error we're generating set the
     * on_error flag until the top caller clears it
     */
    if (!diag->on_error && fydc->level >= FYET_ERROR)
        diag->on_error = true;

    return rc;
}